

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall TPZSkylMatrix<double>::SetSkyline(TPZSkylMatrix<double> *this,TPZVec<long> *skyline)

{
  TPZVec<double_*> *in_stack_00000010;
  double **in_stack_00000028;
  TPZVec<double_*> *in_stack_00000030;
  
  TPZVec<double_*>::Fill(in_stack_00000030,in_stack_00000028,(int64_t)this,(int64_t)skyline);
  InitializeElem((TPZVec<long> *)this,(TPZVec<double> *)skyline,in_stack_00000010);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SetSkyline(const TPZVec<int64_t> &skyline)
{
#ifdef PZDEBUG
	for (int64_t i = 0 ; i < this->Rows() ; i++){
		if (skyline[i] < 0 || skyline[i] > i) DebugStop();
	}
#endif
	fElem.Fill(0);
	InitializeElem(skyline,fStorage,fElem);
}